

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmValue::AddUse(VmValue *this,VmValue *user)

{
  uint uVar1;
  VmValue **ppVVar2;
  
  if ((this->type).size == 0 && (this->type).type == VM_TYPE_VOID) {
    __assert_fail("type != VmType::Void",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x76b,"void VmValue::AddUse(VmValue *)");
  }
  this->hasKnownSimpleUse = false;
  uVar1 = (this->users).count;
  if (uVar1 == (this->users).max) {
    SmallArray<VmValue_*,_8U>::grow(&this->users,uVar1);
  }
  ppVVar2 = (this->users).data;
  if (ppVVar2 != (VmValue **)0x0) {
    uVar1 = (this->users).count;
    (this->users).count = uVar1 + 1;
    ppVVar2[uVar1] = user;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,"void SmallArray<VmValue *, 8>::push_back(const T &) [T = VmValue *, N = 8]");
}

Assistant:

VmInstructionType GetOperationWithLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_ADD:
			return VM_INST_ADD_LOAD;
		case VM_INST_SUB:
			return VM_INST_SUB_LOAD;
		case VM_INST_MUL:
			return VM_INST_MUL_LOAD;
		case VM_INST_DIV:
			return VM_INST_DIV_LOAD;
		case VM_INST_POW:
			return VM_INST_POW_LOAD;
		case VM_INST_MOD:
			return VM_INST_MOD_LOAD;
		case VM_INST_LESS:
			return VM_INST_LESS_LOAD;
		case VM_INST_GREATER:
			return VM_INST_GREATER_LOAD;
		case VM_INST_LESS_EQUAL:
			return VM_INST_LESS_EQUAL_LOAD;
		case VM_INST_GREATER_EQUAL:
			return VM_INST_GREATER_EQUAL_LOAD;
		case VM_INST_EQUAL:
			return VM_INST_EQUAL_LOAD;
		case VM_INST_NOT_EQUAL:
			return VM_INST_NOT_EQUAL_LOAD;
		case VM_INST_SHL:
			return VM_INST_SHL_LOAD;
		case VM_INST_SHR:
			return VM_INST_SHR_LOAD;
		case VM_INST_BIT_AND:
			return VM_INST_BIT_AND_LOAD;
		case VM_INST_BIT_OR:
			return VM_INST_BIT_OR_LOAD;
		case VM_INST_BIT_XOR:
			return VM_INST_BIT_XOR_LOAD;
		default:
			break;
		}

		assert(!"unknown operation");
		return VM_INST_ABORT_NO_RETURN;
	}